

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcTokenizer::push_if(CTcTokenizer *this,tok_if_t state)

{
  tok_if_t tVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = (long)this->if_sp_;
  if (lVar3 != 0) {
    if (this->if_sp_ == 100) {
      throw_fatal_error(0x2721);
    }
    if ((this->if_false_level_ != 0) ||
       ((tVar1 = this->if_stack_[lVar3 + -1].state, tVar1 < (TOKIF_ELSE_YES|TOKIF_IF_NO) &&
        ((0x2cU >> (tVar1 & 0x1f) & 1) != 0)))) {
      this->if_false_level_ = this->if_false_level_ + 1;
    }
  }
  this->if_stack_[lVar3].desc = this->last_desc_;
  this->if_stack_[lVar3].linenum = this->last_linenum_;
  iVar2 = this->if_sp_;
  this->if_sp_ = iVar2 + 1;
  this->if_stack_[iVar2].state = state;
  return;
}

Assistant:

void CTcTokenizer::push_if(tok_if_t state)
{
    /* if we're out of space in the stack, throw a fatal error */
    if (if_sp_ == TOK_MAX_IF_NESTING)
        throw_fatal_error(TCERR_IF_NESTING_OVERFLOW);

    /* 
     *   if we're in a nested #if in a false #if, increase the nested
     *   false #if level 
     */
    if (in_false_if())
        ++if_false_level_;

    /* push the state, remembering where the #if was defined */
    if_stack_[if_sp_].desc = last_desc_;
    if_stack_[if_sp_].linenum = last_linenum_;
    if_stack_[if_sp_++].state = state;
}